

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O2

void __thiscall
Diffusion::diffuse_Ssync
          (Diffusion *this,MultiFab *Ssync,int sigma,int nComp,Real dt,Real be_cn_theta,
          MultiFab *rho_half,int rho_flag,MultiFab **flux,int fluxComp,MultiFab **beta,int betaComp,
          MultiFab *alpha,int alphaComp)

{
  int *piVar1;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> src;
  NavierStokesBase *pNVar2;
  int iVar3;
  ostream *poVar4;
  Print *pPVar5;
  StateDescriptor *this_00;
  string *psVar6;
  FabArray<amrex::FArrayBox> *rho;
  long lVar7;
  ulong uVar8;
  FabArrayBase *pFVar9;
  undefined4 in_register_00000014;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ostringstream *poVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int k;
  int iVar20;
  FabArrayBase *pFVar21;
  Diffusion *this_01;
  long lVar22;
  ulong uVar23;
  bool bVar24;
  Real RVar25;
  double dVar26;
  initializer_list<amrex::Geometry> __l;
  initializer_list<amrex::BoxArray> __l_00;
  initializer_list<amrex::DistributionMapping> __l_01;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> __l_02;
  initializer_list<amrex::MultiFab_*> __l_03;
  initializer_list<const_amrex::MultiFab_*> __l_04;
  allocator_type local_bb3;
  allocator_type local_bb2;
  allocator_type local_bb1;
  long local_bb0;
  Diffusion *local_ba8;
  int flux_allnull;
  Box local_b98;
  Real local_b78;
  long local_b70;
  FabArray<amrex::FArrayBox> *local_b68;
  undefined8 local_b60;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_b58;
  long local_b50;
  ulong local_b48;
  ulong local_b40;
  ulong local_b38;
  int flux_allthere;
  Real local_b28;
  FabArray<amrex::FArrayBox> *local_b20;
  Array4<double> local_b18;
  Real rhsscale;
  Array4<const_double> local_ad0;
  int *local_a90;
  double local_a88;
  Real local_a80;
  array<amrex::LinOpBCType,_3UL> mlmg_hibc;
  int allthere;
  LPInfo local_a60;
  array<amrex::LinOpBCType,_3UL> mlmg_lobc;
  pair<double,_double> scalars;
  ostream local_a18 [376];
  MLMG mlmg;
  MLEBABecLap mlabec;
  MultiFab Soln;
  MultiFab Rhs;
  
  local_b60 = CONCAT44(in_register_00000014,sigma);
  iVar3 = sigma + 3;
  local_bb0 = CONCAT44(local_bb0._4_4_,iVar3);
  local_ba8 = this;
  local_b78 = be_cn_theta;
  local_b68 = &Ssync->super_FabArray<amrex::FArrayBox>;
  local_b28 = dt;
  local_b20 = &rho_half->super_FabArray<amrex::FArrayBox>;
  if (verbose != 0) {
    piVar1 = &this->level;
    iVar20 = 0;
    if (0 < nComp) {
      iVar20 = nComp;
    }
    while (bVar24 = iVar20 != 0, iVar20 = iVar20 + -1, bVar24) {
      poVar4 = amrex::OutStream();
      amrex::Print::Print((Print *)&mlabec,poVar4);
      std::operator<<((ostream *)
                      &mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size
                      ,"Diffusion::diffuse_Ssync lev: ");
      pPVar5 = amrex::Print::operator<<((Print *)&mlabec,piVar1);
      poVar13 = &pPVar5->ss;
      std::operator<<((ostream *)poVar13," ");
      this_00 = amrex::DescriptorList::operator[]((DescriptorList *)amrex::AmrLevel::desc_lst,0);
      psVar6 = amrex::StateDescriptor::name_abi_cxx11_(this_00,iVar3);
      std::operator<<((ostream *)poVar13,(string *)psVar6);
      std::operator<<((ostream *)poVar13,'\n');
      this = (Diffusion *)&mlabec;
      amrex::Print::~Print((Print *)&mlabec);
      iVar3 = iVar3 + 1;
    }
  }
  local_a88 = amrex::ParallelDescriptor::second();
  checkBeta(this,beta,&allthere);
  this_01 = local_ba8;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp = (_func_int **)0x1;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_agglomeration = false;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_consolidation = false;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_semicoarsening = false;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._3_1_ = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.agg_grid_size = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.has_metric_term = false;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._13_3_ = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.max_coarsening_level = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.max_semicoarsening_level = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.semicoarsening_direction = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.hidden_direction = 0;
  amrex::MultiFab::MultiFab
            (&Rhs,local_ba8->grids,local_ba8->dmap,nComp,0,(MFInfo *)&mlabec,
             (local_ba8->navier_stokes->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size);
  amrex::MultiFab::Copy(&Rhs,(MultiFab *)local_b68,(int)local_b60,0,nComp,0);
  if (1 < verbose) {
    mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp = (_func_int **)0x1;
    mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_agglomeration = false;
    mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_consolidation = false;
    mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_semicoarsening = false;
    mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._3_1_ = 0;
    mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.agg_grid_size = 0;
    mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size = 0;
    mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.has_metric_term = false;
    mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._13_3_ = 0;
    mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.max_coarsening_level = 0;
    mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.max_semicoarsening_level = 0;
    mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.semicoarsening_direction = 0;
    mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.hidden_direction = 0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)&mlmg,this_01->grids,this_01->dmap,nComp,0,(MFInfo *)&mlabec,
               (this_01->navier_stokes->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size);
    iVar20 = 0;
    amrex::MultiFab::Copy((MultiFab *)&mlmg,&Rhs,0,0,nComp,0);
    src.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (((this_01->navier_stokes->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start)->new_data)._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    iVar3 = 0;
    if (0 < nComp) {
      iVar3 = nComp;
    }
    piVar1 = &mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size;
    for (; iVar3 != iVar20; iVar20 = iVar20 + 1) {
      if (rho_flag == 2) {
        amrex::MultiFab::Divide
                  ((MultiFab *)&mlmg,
                   (MultiFab *)
                   src.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,3,iVar20,1,0);
      }
      RVar25 = amrex::MultiFab::norm0((MultiFab *)&mlmg,iVar20,0,false,false);
      poVar4 = amrex::OutStream();
      amrex::Print::Print((Print *)&mlabec,poVar4);
      std::operator<<((ostream *)piVar1,"Original max of Ssync of comp ");
      std::ostream::operator<<(piVar1,iVar20);
      std::operator<<((ostream *)piVar1,": ");
      std::ostream::_M_insert<double>(RVar25);
      std::operator<<((ostream *)piVar1,'\n');
      amrex::Print::~Print((Print *)&mlabec);
    }
    amrex::MultiFab::~MultiFab((MultiFab *)&mlmg);
    this_01 = local_ba8;
  }
  rhsscale = 1.0;
  local_a80 = visc_tol;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp = (_func_int **)0x1;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_agglomeration = false;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_consolidation = false;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_semicoarsening = false;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._3_1_ = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.agg_grid_size = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.has_metric_term = false;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._13_3_ = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.max_coarsening_level = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.max_semicoarsening_level = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.semicoarsening_direction = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.hidden_direction = 0;
  amrex::MultiFab::MultiFab
            (&Soln,this_01->grids,this_01->dmap,nComp,1,(MFInfo *)&mlabec,
             (this_01->navier_stokes->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&Soln.super_FabArray<amrex::FArrayBox>,0.0);
  local_a60.do_semicoarsening = false;
  local_a60.agg_grid_size = -1;
  local_a60.con_grid_size = -1;
  local_a60.has_metric_term = true;
  local_a60.do_agglomeration = (anonymous_namespace)::agglomeration != 0;
  local_a60.max_coarsening_level = 0x1e;
  local_a60.max_semicoarsening_level = 0;
  local_a60.semicoarsening_direction = -1;
  local_a60.hidden_direction = -1;
  local_a60.do_consolidation = (anonymous_namespace)::consolidation != 0;
  pNVar2 = this_01->navier_stokes;
  _flux_allthere =
       (EBFArrayBoxFactory *)
       __dynamic_cast((pNVar2->super_AmrLevel).m_factory._M_t.
                      super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                      .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                      _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                      &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (_flux_allthere == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  memcpy(&mlmg,&(pNVar2->super_AmrLevel).geom,200);
  __l._M_len = 1;
  __l._M_array = (iterator)&mlmg;
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
            ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&local_b18,__l,
             (allocator_type *)&flux_allnull);
  amrex::BoxArray::BoxArray((BoxArray *)&scalars,this_01->grids);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&scalars;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_ad0,__l_00,
             &local_bb1);
  std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)&mlmg_hibc
             ,(__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
              this_01->dmap);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&mlmg_hibc;
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
            ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             &local_b98,__l_01,&local_bb2);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&flux_allthere;
  std::vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  ::vector((vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)&mlmg_lobc,__l_02,&local_bb3);
  amrex::MLEBABecLap::MLEBABecLap
            (&mlabec,(Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&local_b18,
             (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_ad0,
             (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             &local_b98,&local_a60,
             (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
              *)&mlmg_lobc,nComp);
  std::
  _Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  ::~_Vector_base((_Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                   *)&mlmg_lobc);
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
            ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             &local_b98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(mlmg_hibc._M_elems + 2));
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
            ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_ad0);
  amrex::BoxArray::~BoxArray((BoxArray *)&scalars);
  std::_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~_Vector_base
            ((_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&local_b18);
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.maxorder = max_order;
  setDomainBC(this_01,&mlmg_lobc,&mlmg_hibc,(int)local_bb0);
  amrex::MLLinOp::setDomainBC((MLLinOp *)&mlabec,&mlmg_lobc,&mlmg_hibc);
  if (0 < this_01->level) {
    amrex::MLLinOp::setCoarseFineBC
              ((MLLinOp *)&mlabec,(MultiFab *)0x0,(this_01->crse_ratio).vect[0]);
  }
  amrex::MLCellLinOp::setLevelBC
            ((MLCellLinOp *)&mlabec,0,(MultiFab *)0x0,(MultiFab *)0x0,(MultiFab *)0x0,
             (MultiFab *)0x0);
  local_b78 = local_b78 * local_b28;
  amrex::MultiFab::MultiFab((MultiFab *)&mlmg);
  scalars.first = 0.0;
  scalars.second = 0.0;
  RVar25 = amrex::StateData::curTime
                     ((this_01->navier_stokes->super_AmrLevel).state.
                      super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                      super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  rho = &amrex::AmrLevel::get_data(&this_01->navier_stokes->super_AmrLevel,0,RVar25)->
         super_FabArray<amrex::FArrayBox>;
  if (rho_flag == 1) {
    rho = local_b20;
  }
  computeAlpha((MultiFab *)&mlmg,&scalars,1.0,local_b78,&rhsscale,alpha,alphaComp,rho_flag,
               (MultiFab *)rho,(uint)(rho_flag != 1) * 3);
  amrex::MLEBABecLap::setScalars(&mlabec,scalars.first,scalars.second);
  amrex::MLEBABecLap::setACoeffs(&mlabec,0,(MultiFab *)&mlmg);
  amrex::MultiFab::~MultiFab((MultiFab *)&mlmg);
  setBeta(&mlabec,beta,betaComp,nComp);
  amrex::MLMG::MLMG(&mlmg,(MLLinOp *)&mlabec);
  mlmg.max_fmg_iters = (anonymous_namespace)::max_fmg_iter;
  mlmg.verbose = verbose;
  amrex::MFIter::MFIter((MFIter *)&scalars,(FabArrayBase *)&Rhs,true);
  local_a90 = &this_01->level;
  local_b48 = 0;
  if (0 < nComp) {
    local_b48 = (ulong)(uint)nComp;
  }
  while ((int)local_a18._16_4_ < (int)local_a18._24_4_) {
    amrex::MFIter::tilebox(&local_b98,(MFIter *)&scalars);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_b18,&Rhs.super_FabArray<amrex::FArrayBox>,(MFIter *)&scalars);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_ad0,local_b20,(MFIter *)&scalars);
    lVar7 = (long)local_b98.smallend.vect[1];
    local_b50 = (long)local_b98.smallend.vect[2];
    local_bb0 = local_ad0.kstride * 8;
    local_b58._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
         ((lVar7 - local_ad0.begin.y) * local_ad0.jstride * 8 +
          (local_b50 - local_ad0.begin.z) * local_bb0 + (long)local_b98.smallend.vect[0] * 8 +
          (long)local_ad0.begin.x * -8 + (long)local_ad0.p);
    local_b70 = local_b18.nstride * 8;
    uVar11 = 0;
    uVar23 = (lVar7 - local_b18.begin.y) * local_b18.jstride * 8 +
             (local_b50 - local_b18.begin.z) * local_b18.kstride * 8 +
             (long)local_b98.smallend.vect[0] * 8 + (long)local_b18.begin.x * -8 + (long)local_b18.p
    ;
    while (uVar10 = uVar23, uVar8 = uVar11,
          pFVar9 = (FabArrayBase *)
                   local_b58._M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl, uVar11 = uVar10,
          lVar15 = local_b50, uVar8 != local_b48) {
      for (; lVar18 = lVar7, pFVar21 = pFVar9, uVar23 = uVar11, lVar15 <= local_b98.bigend.vect[2];
          lVar15 = lVar15 + 1) {
        for (; lVar18 <= local_b98.bigend.vect[1]; lVar18 = lVar18 + 1) {
          if (local_b98.smallend.vect[0] <= local_b98.bigend.vect[0]) {
            lVar16 = 0;
            do {
              dVar26 = *(double *)(uVar23 + lVar16 * 8) * rhsscale;
              *(double *)(uVar23 + lVar16 * 8) = dVar26;
              if (rho_flag == 1) {
                *(double *)(uVar23 + lVar16 * 8) =
                     dVar26 * (double)(&pFVar21->_vptr_FabArrayBase)[lVar16];
              }
              lVar16 = lVar16 + 1;
            } while ((local_b98.bigend.vect[0] - local_b98.smallend.vect[0]) + 1 != (int)lVar16);
          }
          pFVar21 = (FabArrayBase *)(&pFVar21->_vptr_FabArrayBase + local_ad0.jstride);
          uVar23 = uVar23 + local_b18.jstride * 8;
        }
        pFVar9 = (FabArrayBase *)(&pFVar9->_vptr_FabArrayBase + local_ad0.kstride);
        uVar11 = uVar11 + local_b18.kstride * 8;
      }
      uVar23 = uVar10 + local_b70;
      local_b40 = uVar8;
      local_b38 = uVar10;
      uVar11 = uVar8 + 1;
    }
    amrex::MFIter::operator++((MFIter *)&scalars);
    this_01 = local_ba8;
  }
  amrex::MFIter::~MFIter((MFIter *)&scalars);
  local_ad0.p = (double *)&Soln;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_ad0;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&scalars,__l_03,
             (allocator_type *)&flux_allthere);
  local_b98.smallend.vect._0_8_ = &Rhs;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&local_b98;
  std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
            ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)&local_b18
             ,__l_04,(allocator_type *)&flux_allnull);
  amrex::MLMG::solve(&mlmg,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&scalars
                     ,(Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                      &local_b18,local_a80,-1.0,(char *)0x0);
  std::_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
  ~_Vector_base((_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                &local_b18);
  std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
            ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&scalars);
  checkBeta(flux,&flux_allthere,&flux_allnull);
  if (flux_allthere != 0) {
    computeExtensiveFluxes
              (&mlmg,&Soln,flux,fluxComp,nComp,(MultiFab *)&this_01->navier_stokes->field_0x540,
               local_b78 / local_b28);
  }
  amrex::MultiFab::Copy((MultiFab *)local_b68,&Soln,0,(int)local_b60,nComp,0);
  if (1 < verbose) {
    for (iVar3 = 0; (int)local_b48 != iVar3; iVar3 = iVar3 + 1) {
      RVar25 = amrex::MultiFab::norm0
                         (&Soln,iVar3,
                          Soln.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0],
                          false,false);
      poVar4 = amrex::OutStream();
      amrex::Print::Print((Print *)&scalars,poVar4);
      std::operator<<(local_a18,"Final max of Ssync for comp ");
      std::ostream::operator<<(local_a18,iVar3);
      std::operator<<(local_a18,": ");
      std::ostream::_M_insert<double>(RVar25);
      std::operator<<(local_a18,'\n');
      amrex::Print::~Print((Print *)&scalars);
    }
  }
  if (rho_flag == 2) {
    local_b58._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (((local_ba8->navier_stokes->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start)->new_data)._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
    amrex::MFIter::MFIter
              ((MFIter *)&scalars,
               (FabArrayBase *)
               local_b58._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
    while ((int)local_a18._16_4_ < (int)local_a18._24_4_) {
      amrex::MFIter::tilebox(&local_b98,(MFIter *)&scalars);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_b18,local_b68,(MFIter *)&scalars,(int)local_b60);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_ad0,
                 (FabArray<amrex::FArrayBox> *)
                 local_b58._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(MFIter *)&scalars,3);
      lVar15 = (long)local_b98.smallend.vect[1];
      local_b70 = (long)local_b98.smallend.vect[2];
      local_b40 = local_b18.nstride * 8;
      local_b50 = (lVar15 - local_ad0.begin.y) * local_ad0.jstride * 8 +
                  (local_b70 - local_ad0.begin.z) * local_ad0.kstride * 8 +
                  (long)local_b98.smallend.vect[0] * 8 + (long)local_ad0.begin.x * -8 +
                  (long)local_ad0.p;
      lVar7 = (lVar15 - local_b18.begin.y) * local_b18.jstride * 8 +
              (local_b70 - local_b18.begin.z) * local_b18.kstride * 8 +
              (long)local_b98.smallend.vect[0] * 8 + (long)local_b18.begin.x * -8 +
              (long)local_b18.p;
      uVar11 = 0;
      while (uVar23 = uVar11, lVar12 = lVar7, lVar7 = local_b70, lVar18 = local_b50, lVar16 = lVar12
            , uVar23 != local_b48) {
        for (; lVar14 = lVar18, lVar19 = lVar15, lVar22 = lVar16, lVar7 <= local_b98.bigend.vect[2];
            lVar7 = lVar7 + 1) {
          for (; lVar19 <= local_b98.bigend.vect[1]; lVar19 = lVar19 + 1) {
            if (local_b98.smallend.vect[0] <= local_b98.bigend.vect[0]) {
              lVar17 = 0;
              do {
                *(double *)(lVar22 + lVar17 * 8) =
                     *(double *)(lVar14 + lVar17 * 8) * *(double *)(lVar22 + lVar17 * 8);
                lVar17 = lVar17 + 1;
              } while ((local_b98.bigend.vect[0] - local_b98.smallend.vect[0]) + 1 != (int)lVar17);
            }
            lVar22 = lVar22 + local_b18.jstride * 8;
            lVar14 = lVar14 + local_ad0.jstride * 8;
          }
          lVar18 = lVar18 + local_ad0.kstride * 8;
          lVar16 = lVar16 + local_b18.kstride * 8;
        }
        lVar7 = lVar12 + local_b40;
        local_bb0 = lVar12;
        local_b38 = uVar23;
        uVar11 = uVar23 + 1;
      }
      amrex::MFIter::operator++((MFIter *)&scalars);
    }
    amrex::MFIter::~MFIter((MFIter *)&scalars);
  }
  if (verbose != 0) {
    dVar26 = amrex::ParallelDescriptor::second();
    poVar4 = amrex::OutStream();
    amrex::Print::Print((Print *)&scalars,poVar4);
    std::operator<<(local_a18,"Diffusion::diffuse_Ssync(): lev: ");
    pPVar5 = amrex::Print::operator<<((Print *)&scalars,local_a90);
    std::operator<<((ostream *)&pPVar5->ss,", time: ");
    std::ostream::_M_insert<double>(dVar26 - local_a88);
    std::operator<<((ostream *)&pPVar5->ss,'\n');
    amrex::Print::~Print((Print *)&scalars);
  }
  amrex::MLMG::~MLMG(&mlmg);
  amrex::MLEBABecLap::~MLEBABecLap(&mlabec);
  amrex::MultiFab::~MultiFab(&Soln);
  amrex::MultiFab::~MultiFab(&Rhs);
  return;
}

Assistant:

void
Diffusion::diffuse_Ssync (MultiFab&              Ssync,
                          int                    sigma,
                          int                    nComp,
                          Real                   dt,
                          Real                   be_cn_theta,
                          const MultiFab&        rho_half,
                          int                    rho_flag,
                          MultiFab* const*       flux,
                          int                    fluxComp,
                          const MultiFab* const* beta,
                          int                    betaComp,
                          const MultiFab*        alpha,
                          int                    alphaComp)
{
    const int state_ind    = sigma + AMREX_SPACEDIM;
    if (verbose)
    {
       for (int comp = 0; comp < nComp; ++comp) {
          amrex::Print() << "Diffusion::diffuse_Ssync lev: " << level << " "
                         << navier_stokes->get_desc_lst()[State_Type].name(state_ind+comp) << '\n';
       }
    }

    const Real strt_time = ParallelDescriptor::second();

    int allthere;
    checkBeta(beta, allthere);

    MultiFab  Rhs(grids,dmap,nComp,0,MFInfo(),navier_stokes->Factory());

    MultiFab::Copy(Rhs,Ssync,sigma,0,nComp,0);

    if (verbose > 1)
    {
        MultiFab junk(grids,dmap,nComp,0,MFInfo(),navier_stokes->Factory());
        MultiFab::Copy(junk,Rhs,0,0,nComp,0);
        MultiFab& S_new = navier_stokes->get_new_data(State_Type);
        for (int comp = 0; comp < nComp; ++comp) {
            if (rho_flag == 2)
            {
                MultiFab::Divide(junk, S_new, Density, comp, 1, 0);
            }
            Real r_norm = junk.norm0(comp);
            amrex::Print() << "Original max of Ssync of comp " << comp << ": " << r_norm << '\n';
        }
    }
    //
    // SET UP COEFFICIENTS FOR VISCOUS SOLVER.
    //
    const Real  a = 1.0;
    Real        b = be_cn_theta*dt;
    Real rhsscale = 1.0;

    const Real S_tol     = visc_tol;
    const Real S_tol_abs = -1;

    MultiFab Soln(grids,dmap,nComp,1,MFInfo(),navier_stokes->Factory());
    Soln.setVal(0.0);

    LPInfo info;
    info.setAgglomeration(agglomeration);
    info.setConsolidation(consolidation);

#ifdef AMREX_USE_EB
    const auto& ebf = &dynamic_cast<EBFArrayBoxFactory const&>(navier_stokes->Factory());
    MLEBABecLap mlabec({navier_stokes->Geom()}, {grids}, {dmap}, info, {ebf}, nComp);
#else
    MLABecLaplacian mlabec({navier_stokes->Geom()}, {grids}, {dmap}, info, {}, nComp);
#endif
    mlabec.setMaxOrder(max_order);

    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc;
    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc;
    setDomainBC(mlmg_lobc, mlmg_hibc, state_ind);

    mlabec.setDomainBC(mlmg_lobc, mlmg_hibc);
    if (level > 0) {
      mlabec.setCoarseFineBC(nullptr, crse_ratio[0]);
    }
    mlabec.setLevelBC(0, nullptr);

    {
      MultiFab acoef;
      std::pair<Real,Real> scalars;
      const Real cur_time = navier_stokes->get_state_data(State_Type).curTime();
      MultiFab& S = navier_stokes->get_data(State_Type,cur_time);
      const MultiFab& rho = (rho_flag == 1) ? rho_half : S;
      const int Rho_comp = (rho_flag ==1) ? 0 : Density;

      computeAlpha(acoef, scalars, a, b,
                   &rhsscale, alpha, alphaComp,
                   rho_flag, &rho, Rho_comp);
      mlabec.setScalars(scalars.first, scalars.second);
      mlabec.setACoeffs(0, acoef);
    }

    setBeta(mlabec, beta, betaComp, nComp);

    MLMG mlmg(mlabec);
    if (use_hypre) {
      mlmg.setBottomSolver(MLMG::BottomSolver::hypre);
      mlmg.setBottomVerbose(hypre_verbose);
    }
    mlmg.setMaxFmgIter(max_fmg_iter);
    mlmg.setVerbose(verbose);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(Rhs, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto const& rhs_arr  = Rhs.array(mfi);
        auto const& rhoh_arr = rho_half.const_array(mfi);
        amrex::ParallelFor(bx, nComp, [=]
        AMREX_GPU_DEVICE(int i, int j, int k, int n) noexcept
        {
            rhs_arr(i,j,k,n) *= rhsscale;
            if (rho_flag == 1) {
               rhs_arr(i,j,k,n) *= rhoh_arr(i,j,k);
            }
        });
    }

    mlmg.solve({&Soln}, {&Rhs}, S_tol, S_tol_abs);

    int flux_allthere, flux_allnull;
    checkBeta(flux, flux_allthere, flux_allnull);
    if (flux_allthere)
    {
        computeExtensiveFluxes(mlmg, Soln, flux, fluxComp, nComp,
			       navier_stokes->area, b/dt);
    }

    MultiFab::Copy(Ssync,Soln,0,sigma,nComp,0);

    if (verbose > 1)
    {
        for (int comp = 0; comp < nComp; ++comp) {
           Real s_norm = Soln.norm0(comp,Soln.nGrow());
           amrex::Print() << "Final max of Ssync for comp " << comp << ": " << s_norm << '\n';
        }
    }

    if (rho_flag == 2)
    {
        MultiFab& S_new = navier_stokes->get_new_data(State_Type);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
       for (MFIter mfi(S_new, TilingIfNotGPU()); mfi.isValid(); ++mfi)
       {
           const Box& bx = mfi.tilebox();
           auto const& ssync_arr = Ssync.array(mfi,sigma);
           auto const& rho_arr   = S_new.const_array(mfi,Density);
           amrex::ParallelFor(bx, nComp, [ssync_arr, rho_arr]
           AMREX_GPU_DEVICE(int i, int j, int k, int n) noexcept
           {
               ssync_arr(i,j,k,n) *= rho_arr(i,j,k);
           });
       }
    }

    if (verbose)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - strt_time;
        ParallelDescriptor::ReduceRealMax(run_time,IOProc);
        amrex::Print() << "Diffusion::diffuse_Ssync(): lev: " << level
                       << ", time: " << run_time << '\n';
    }
}